

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::InnerMap::
iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
::operator++(iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
             *this)

{
  void *pvVar1;
  bool bVar2;
  Node *pNVar3;
  LogMessage *other;
  size_type start_bucket;
  ulong uVar4;
  LogMessage local_68;
  TreeIterator local_30;
  TreeIterator tree_it;
  
  pNVar3 = this->node_->next;
  if (pNVar3 == (Node *)0x0) {
    local_30._M_node = (_Rb_tree_node_base *)0x0;
    bVar2 = revalidate_if_necessary(this,&local_30);
    uVar4 = this->bucket_index_;
    if (bVar2) {
      start_bucket = uVar4 + 1;
    }
    else {
      if ((uVar4 & 1) != 0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/map.h"
                   ,0x1f5);
        other = internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: (bucket_index_ & 1) == (0u): ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&tree_it._M_node + 7),other);
        internal::LogMessage::~LogMessage(&local_68);
        uVar4 = this->bucket_index_;
      }
      pvVar1 = this->m_->table_[uVar4];
      local_30._M_node = (_Base_ptr)std::_Rb_tree_increment(local_30._M_node);
      if (local_30._M_node != (_Rb_tree_node_base *)((long)pvVar1 + 0x10)) {
        pNVar3 = *(Node **)(local_30._M_node + 1);
        goto LAB_0030c9e4;
      }
      start_bucket = uVar4 + 2;
    }
    SearchFrom(this,start_bucket);
  }
  else {
LAB_0030c9e4:
    this->node_ = pNVar3;
  }
  return this;
}

Assistant:

iterator_base& operator++() {
        if (node_->next == nullptr) {
          TreeIterator tree_it;
          const bool is_list = revalidate_if_necessary(&tree_it);
          if (is_list) {
            SearchFrom(bucket_index_ + 1);
          } else {
            GOOGLE_DCHECK_EQ(bucket_index_ & 1, 0u);
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            if (++tree_it == tree->end()) {
              SearchFrom(bucket_index_ + 2);
            } else {
              node_ = NodePtrFromKeyPtr(*tree_it);
            }
          }
        } else {
          node_ = node_->next;
        }
        return *this;
      }